

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O1

void __thiscall
wasm::WasmBinaryWriter::writeExtraDebugLocation
          (WasmBinaryWriter *this,Expression *curr,Function *func,size_t id)

{
  int iVar1;
  int iVar2;
  mapped_type *this_00;
  uint *puVar3;
  Expression *local_20;
  Expression *curr_local;
  
  if ((func != (Function *)0x0) && ((func->expressionLocations)._M_h._M_element_count != 0)) {
    iVar1 = *(int *)&(this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish;
    iVar2 = *(int *)&(this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
    local_20 = curr;
    this_00 = std::__detail::
              _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>_>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>_>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&(this->binaryLocations).delimiters,&local_20);
    puVar3 = ZeroInitSmallVector<unsigned_int,_1UL>::operator[](this_00,id);
    *puVar3 = iVar1 - iVar2;
  }
  return;
}

Assistant:

void WasmBinaryWriter::writeExtraDebugLocation(Expression* curr,
                                               Function* func,
                                               size_t id) {
  if (func && !func->expressionLocations.empty()) {
    binaryLocations.delimiters[curr][id] = o.size();
  }
}